

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-inventory.c
# Opt level: O0

_Bool borg_item_worth_id(borg_item_conflict *item)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t slot;
  borg_item_conflict *item_local;
  
  _Var1 = borg_item_note_needs_id(item);
  if (_Var1) {
    wVar2 = borg_wield_slot(item);
    if (wVar2 < L'\0') {
      item_local._7_1_ = false;
    }
    else {
      item_local._7_1_ = true;
    }
  }
  else {
    item_local._7_1_ = false;
  }
  return item_local._7_1_;
}

Assistant:

bool borg_item_worth_id(const borg_item *item)
{
    int        slot;

    if (!borg_item_note_needs_id(item))
        return false;

    /* Things that can't be wielded can't be ID'd (potions, scrolls etc) */
    slot = borg_wield_slot(item);
    if (slot < 0)
        return false;

    return true;
}